

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O3

size_t __thiscall
OpenSSLWrapper::SslConnection::SslWrite
          (SslConnection *this,uint8_t *szBuffer,size_t nWriteLen,int *iErrorHint)

{
  mutex *__mutex;
  uint __val;
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  long *plVar5;
  undefined8 *puVar6;
  runtime_error *this_00;
  uint uVar7;
  ulong *puVar8;
  long *plVar9;
  ulong uVar10;
  SslConnection *this_01;
  uint __len;
  string __str;
  size_t nWritten;
  long *local_d8;
  undefined8 local_d0;
  long local_c8;
  undefined8 uStack_c0;
  ulong *local_b8;
  long local_b0;
  ulong local_a8;
  long lStack_a0;
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  size_t local_58;
  string local_50;
  
  if (this->m_ssl == (SSL *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Not Initialized");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __mutex = &this->m_mxSsl;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  ERR_clear_error();
  local_58 = 0;
  uVar3 = SSL_write_ex(this->m_ssl,szBuffer,nWriteLen);
  if (0 < (int)uVar3) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return local_58;
  }
  this_01 = (SslConnection *)(ulong)uVar3;
  uVar3 = SSL_get_error((SSL *)this->m_ssl,uVar3);
  if (iErrorHint != (int *)0x0) {
    *iErrorHint = uVar3;
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  switch(uVar3) {
  case 2:
    *(byte *)&this->m_iWantState = (byte)this->m_iWantState | 1;
    break;
  case 3:
    *(byte *)&this->m_iWantState = (byte)this->m_iWantState | 2;
    break;
  default:
    goto switchD_00122a5c_caseD_4;
  case 5:
    puVar4 = (uint *)__errno_location();
    uVar3 = *puVar4;
switchD_00122a5c_caseD_4:
    GetSslErrAsString_abi_cxx11_(&local_50,this_01);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    puVar8 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar8) {
      local_a8 = *puVar8;
      lStack_a0 = plVar5[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *puVar8;
      local_b8 = (ulong *)*plVar5;
    }
    local_b0 = plVar5[1];
    *plVar5 = (long)puVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    __val = -uVar3;
    if (0 < (int)uVar3) {
      __val = uVar3;
    }
    __len = 1;
    if (9 < __val) {
      uVar10 = (ulong)__val;
      uVar1 = 4;
      do {
        __len = uVar1;
        uVar7 = (uint)uVar10;
        if (uVar7 < 100) {
          __len = __len - 2;
          goto LAB_00122b4e;
        }
        if (uVar7 < 1000) {
          __len = __len - 1;
          goto LAB_00122b4e;
        }
        if (uVar7 < 10000) goto LAB_00122b4e;
        uVar10 = uVar10 / 10000;
        uVar1 = __len + 4;
      } while (99999 < uVar7);
      __len = __len + 1;
    }
LAB_00122b4e:
    local_98 = local_88;
    std::__cxx11::string::_M_construct((ulong)&local_98,(char)__len - (char)((int)uVar3 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar3 >> 0x1f) + (long)local_98),__len,__val);
    uVar10 = 0xf;
    if (local_b8 != &local_a8) {
      uVar10 = local_a8;
    }
    if (uVar10 < (ulong)(local_90 + local_b0)) {
      uVar10 = 0xf;
      if (local_98 != local_88) {
        uVar10 = local_88[0];
      }
      if (uVar10 < (ulong)(local_90 + local_b0)) goto LAB_00122bc1;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_b8);
    }
    else {
LAB_00122bc1:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_98);
    }
    local_d8 = &local_c8;
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_c8 = *plVar5;
      uStack_c0 = puVar6[3];
    }
    else {
      local_c8 = *plVar5;
      local_d8 = (long *)*puVar6;
    }
    local_d0 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)plVar5 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
    plVar9 = plVar5 + 2;
    if ((long *)*plVar5 == plVar9) {
      local_68 = *plVar9;
      lStack_60 = plVar5[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar9;
      local_78 = (long *)*plVar5;
    }
    local_70 = plVar5[1];
    *plVar5 = (long)plVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    OutputDebugStringA((char *)local_78);
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_98 != local_88) {
      operator_delete(local_98,local_88[0] + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    this->m_iShutDownFlag = 1;
    if ((this->m_fError).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(this->m_fError)._M_invoker)((_Any_data *)&this->m_fError);
    }
    break;
  case 6:
    this->m_bZeroReceived = true;
    ShutDownConnection(this,iErrorHint);
  }
  return 0;
}

Assistant:

size_t SslConnection::SslWrite(const uint8_t* szBuffer, size_t nWriteLen, int* iErrorHint/* = nullptr*/)
    {
        if (nullptr == m_ssl)
            throw runtime_error("Not Initialized");

        //OSSL_HANDSHAKE_STATE hsState = SSL_get_state(m_ssl);
        //if (hsState != TLS_ST_OK)
        //    OutputDebugString(wstring(L"SSL invalid state: " + to_wstring(hsState) + L" on ssl context: " + to_wstring(reinterpret_cast<size_t>(m_ssl)) + L"\r\n").c_str());

        m_mxSsl.lock();

        ERR_clear_error();
        size_t nWritten = 0;
        int iResult = SSL_write_ex(m_ssl, szBuffer, nWriteLen, &nWritten);
        if (iResult <= 0)
        {
            iResult = SSL_get_error(m_ssl, iResult);
            if (iErrorHint != nullptr)
                *iErrorHint = iResult;
            m_mxSsl.unlock();

            switch (iResult)
            {
            case SSL_ERROR_WANT_READ:
                m_iWantState |= 1; break;
            case SSL_ERROR_WANT_WRITE:
                m_iWantState |= 2; break;
            case SSL_ERROR_ZERO_RETURN:
                m_bZeroReceived = true;
                ShutDownConnection(iErrorHint);
                break;
            case SSL_ERROR_SYSCALL:
                iResult = errno;
                [[fallthrough]];
            default:
OutputDebugStringA(string(GetSslErrAsString() + "errno = " + to_string(iResult) + "\r\n").c_str());
                m_iShutDownFlag = 1;
                if (m_fError)
                    m_fError();
            }

            return 0;
        }
        m_mxSsl.unlock();

        return nWritten;
    }